

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrum_dls.cpp
# Opt level: O0

Instrument * Timidity::load_instrument_dls(Renderer *song,int drum,int bank,int instrument)

{
  uint uVar1;
  DLS_Data *pDVar2;
  DLS_Instrument *local_40;
  DLS_Instrument *dls_ins;
  DWORD i;
  Instrument *inst;
  int instrument_local;
  int bank_local;
  int drum_local;
  Renderer *song_local;
  
  local_40 = (DLS_Instrument *)0x0;
  if (song->patches == (DLS_Data *)0x0) {
    song_local = (Renderer *)0x0;
  }
  else {
    uVar1 = 0;
    if (drum != 0) {
      uVar1 = 0x80000000;
    }
    dls_ins._4_4_ = 0;
    while ((dls_ins._4_4_ < song->patches->cInstruments &&
           (((local_40 = song->patches->instruments + dls_ins._4_4_,
             ((local_40->header->Locale).ulBank & 0x80000000) != uVar1 ||
             (((local_40->header->Locale).ulBank >> 8 & 0xff) != bank)) ||
            ((local_40->header->Locale).ulInstrument != instrument))))) {
      dls_ins._4_4_ = dls_ins._4_4_ + 1;
    }
    if ((dls_ins._4_4_ == song->patches->cInstruments) && (bank == 0)) {
      dls_ins._4_4_ = 0;
      while ((dls_ins._4_4_ < song->patches->cInstruments &&
             ((local_40 = song->patches->instruments + dls_ins._4_4_,
              ((local_40->header->Locale).ulBank & 0x80000000) != uVar1 ||
              ((local_40->header->Locale).ulInstrument != instrument))))) {
        dls_ins._4_4_ = dls_ins._4_4_ + 1;
      }
    }
    if (dls_ins._4_4_ == song->patches->cInstruments) {
      song_local = (Renderer *)0x0;
    }
    else {
      song_local = (Renderer *)safe_malloc(0x10);
      song_local->rate = (float)local_40->header->cRegions;
      pDVar2 = (DLS_Data *)safe_malloc((long)(int)song_local->rate * 0x68);
      song_local->patches = pDVar2;
      memset(song_local->patches,0,(long)(int)song_local->rate * 0x68);
      for (dls_ins._4_4_ = 0; dls_ins._4_4_ < local_40->header->cRegions;
          dls_ins._4_4_ = dls_ins._4_4_ + 1) {
        load_region_dls(song,(Sample *)((long)song_local->patches + (ulong)dls_ins._4_4_ * 0x68),
                        local_40,dls_ins._4_4_);
      }
    }
  }
  return (Instrument *)song_local;
}

Assistant:

Instrument *load_instrument_dls(Renderer *song, int drum, int bank, int instrument)
{
	Instrument *inst;
	DWORD i;
	DLS_Instrument *dls_ins = NULL;

	if (song->patches == NULL)
	{
		return NULL;
	}
	drum = drum ? 0x80000000 : 0;
	for (i = 0; i < song->patches->cInstruments; ++i)
	{
		dls_ins = &song->patches->instruments[i];
		if ((dls_ins->header->Locale.ulBank & 0x80000000) == (ULONG)drum &&
			((dls_ins->header->Locale.ulBank >> 8) & 0xFF) == (ULONG)bank &&
			dls_ins->header->Locale.ulInstrument == (ULONG)instrument)
			break;
	}
	if (i == song->patches->cInstruments && bank == 0)
	{
		for (i = 0; i < song->patches->cInstruments; ++i)
		{
			dls_ins = &song->patches->instruments[i];
			if ((dls_ins->header->Locale.ulBank & 0x80000000) == (ULONG)drum &&
				dls_ins->header->Locale.ulInstrument == (ULONG)instrument)
				break;
		}
	}
	if (i == song->patches->cInstruments)
	{
//		SNDDBG(("Couldn't find %s instrument %d in bank %d\n", drum ? "drum" : "melodic", instrument, bank));
		return NULL;
	}

	inst = (Instrument *)safe_malloc(sizeof(Instrument));
	inst->samples = dls_ins->header->cRegions;
	inst->sample = (Sample *)safe_malloc(inst->samples * sizeof(Sample));
	memset(inst->sample, 0, inst->samples * sizeof(Sample));
	/*
	printf("Found %s instrument %d in bank %d named %s with %d regions\n", drum ? "drum" : "melodic", instrument, bank, dls_ins->name, inst->samples);
	*/
	for (i = 0; i < dls_ins->header->cRegions; ++i)
	{
		load_region_dls(song, &inst->sample[i], dls_ins, i);
	}
	return inst;
}